

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_conf_own_cert
              (mbedtls_ssl_config *conf,mbedtls_x509_crt *own_cert,mbedtls_pk_context *pk_key)

{
  mbedtls_ssl_key_cert *pmVar1;
  mbedtls_ssl_key_cert *pmVar2;
  mbedtls_ssl_key_cert *pmVar3;
  
  if (own_cert == (mbedtls_x509_crt *)0x0) {
    pmVar2 = conf->key_cert;
    while (pmVar2 != (mbedtls_ssl_key_cert *)0x0) {
      pmVar1 = pmVar2->next;
      free(pmVar2);
      pmVar2 = pmVar1;
    }
    conf->key_cert = (mbedtls_ssl_key_cert *)0x0;
  }
  else {
    pmVar2 = (mbedtls_ssl_key_cert *)calloc(1,0x18);
    if (pmVar2 == (mbedtls_ssl_key_cert *)0x0) {
      return -0x7f00;
    }
    pmVar2->cert = own_cert;
    pmVar2->key = pk_key;
    pmVar2->next = (mbedtls_ssl_key_cert *)0x0;
    pmVar1 = conf->key_cert;
    if (conf->key_cert == (mbedtls_ssl_key_cert *)0x0) {
      conf->key_cert = pmVar2;
    }
    else {
      do {
        pmVar3 = pmVar1;
        pmVar1 = pmVar3->next;
      } while (pmVar1 != (mbedtls_ssl_key_cert *)0x0);
      pmVar3->next = pmVar2;
    }
  }
  return 0;
}

Assistant:

int mbedtls_ssl_conf_own_cert(mbedtls_ssl_config *conf,
                              mbedtls_x509_crt *own_cert,
                              mbedtls_pk_context *pk_key)
{
    return ssl_append_key_cert(&conf->key_cert, own_cert, pk_key);
}